

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void debug(char *fmt,...)

{
  return;
}

Assistant:

void
debug(char *fmt, ...)
{
#ifdef DEBUGGING
	va_list ap;

	if (!debugging)
		return;

	va_start(ap, fmt);
	vfprintf(stderr, fmt, ap);
	va_end(ap);
#else
	(void)(fmt);
#endif	/* DEBUGGING */
}